

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O3

void __thiscall OnDiskIndex::OnDiskIndex(OnDiskIndex *this,string *fname)

{
  RawFile *this_00;
  uint64_t uVar1;
  runtime_error *this_01;
  pointer __p;
  __off_t in_R8;
  OnDiskIndexHeader header;
  path local_b0;
  path local_70;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_70,fname);
  if (local_70._M_pathname._M_string_length == 0) {
    local_b0._M_pathname._M_dataplus._M_p = (pointer)&local_b0._M_pathname.field_2;
    local_b0._M_pathname._M_string_length = 0;
    local_b0._M_pathname.field_2._M_local_buf[0] = '\0';
    local_b0._M_cmpts.
    super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0._M_cmpts.
    super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_b0._M_cmpts.
    super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_b0._M_cmpts.
    super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_b0._49_8_ = 0;
  }
  else {
    __p = (pointer)&local_70;
    if (local_70._M_type == _Multi) {
      __p = local_70._M_cmpts.
            super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
    }
    std::experimental::filesystem::v1::__cxx11::path::path(&local_b0,&__p->super_path);
  }
  (this->fname)._M_dataplus._M_p = (pointer)&(this->fname).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->fname,local_b0._M_pathname._M_dataplus._M_p,
             local_b0._M_pathname._M_dataplus._M_p + local_b0._M_pathname._M_string_length);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_b0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&this->fpath,fname);
  this_00 = &this->ndxfile;
  RawFile::RawFile(this_00,fname,0,0);
  uVar1 = RawFile::size(this_00);
  this->index_size = uVar1;
  if (uVar1 < 0x8000018) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"corrupted index, file is too small");
  }
  else {
    RawFile::pread(this_00,(int)&local_b0,(void *)0x10,0,in_R8);
    if ((int)local_b0._M_pathname._M_dataplus._M_p == 0xca7da7a) {
      if (local_b0._M_pathname._M_dataplus._M_p._4_4_ == 6) {
        if ((IndexType)local_b0._M_pathname._M_string_length - GRAM3 < 4) {
          if (local_b0._M_pathname._M_string_length._4_4_ == 0) {
            this->ntype = (IndexType)local_b0._M_pathname._M_string_length;
            return;
          }
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"reserved field != 0");
        }
        else {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"invalid index type");
        }
      }
      else {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"unsupported version");
      }
    }
    else {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"invalid magic, not a catdata");
    }
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

OnDiskIndex::OnDiskIndex(const std::string &fname)
    : fname(fs::path(fname).filename()),
      fpath(fs::path(fname)),
      ndxfile(fname) {
    OnDiskIndexHeader header;

    index_size = ndxfile.size();

    if (index_size < DATA_OFFSET + RUN_ARRAY_SIZE) {
        throw std::runtime_error("corrupted index, file is too small");
    }

    ndxfile.pread(&header, sizeof(OnDiskIndexHeader), 0);

    if (header.magic != DB_MAGIC) {
        throw std::runtime_error("invalid magic, not a catdata");
    }

    if (header.version != OnDiskIndex::VERSION) {
        throw std::runtime_error("unsupported version");
    }

    if (!is_valid_index_type(header.raw_type)) {
        throw std::runtime_error("invalid index type");
    }

    if (header.reserved != 0) {
        throw std::runtime_error("reserved field != 0");
    }

    ntype = static_cast<IndexType>(header.raw_type);
}